

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O1

array * json::array::parse(Pig *pig)

{
  pointer *pppvVar1;
  iterator iVar2;
  bool bVar3;
  size_type sVar4;
  array *paVar5;
  string *psVar6;
  value *value;
  value *local_50;
  string local_48;
  
  sVar4 = Pig::cursor(pig);
  Pig::skipWS(pig);
  bVar3 = Pig::skip(pig,0x5b);
  if (bVar3) {
    Pig::skipWS(pig);
    paVar5 = (array *)operator_new(0x20);
    (paVar5->super_value)._vptr_value = (_func_int **)&PTR__array_001a1bc8;
    (paVar5->_data).super__Vector_base<json::value_*,_std::allocator<json::value_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (paVar5->_data).super__Vector_base<json::value_*,_std::allocator<json::value_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (paVar5->_data).super__Vector_base<json::value_*,_std::allocator<json::value_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_50 = json::value::parse(pig);
    if (local_50 != (value *)0x0) {
      iVar2._M_current =
           (paVar5->_data).super__Vector_base<json::value_*,_std::allocator<json::value_*>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (paVar5->_data).super__Vector_base<json::value_*,_std::allocator<json::value_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<json::value*,std::allocator<json::value*>>::
        _M_realloc_insert<json::value*const&>
                  ((vector<json::value*,std::allocator<json::value*>> *)&paVar5->_data,iVar2,
                   &local_50);
      }
      else {
        *iVar2._M_current = local_50;
        pppvVar1 = &(paVar5->_data).
                    super__Vector_base<json::value_*,_std::allocator<json::value_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppvVar1 = *pppvVar1 + 1;
      }
      local_50 = (value *)0x0;
      Pig::skipWS(pig);
      bVar3 = Pig::skip(pig,0x2c);
      if (bVar3) {
        do {
          Pig::skipWS(pig);
          local_50 = json::value::parse(pig);
          if (local_50 == (value *)0x0) {
            (*(paVar5->super_value)._vptr_value[1])(paVar5);
            psVar6 = (string *)__cxa_allocate_exception(0x20);
            local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_48,"Error: missing value after \',\' at position {1}","");
            sVar4 = Pig::cursor(pig);
            format<int>(psVar6,1,&local_48,(int)sVar4);
            __cxa_throw(psVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          iVar2._M_current =
               (paVar5->_data).super__Vector_base<json::value_*,_std::allocator<json::value_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (paVar5->_data).super__Vector_base<json::value_*,_std::allocator<json::value_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<json::value*,std::allocator<json::value*>>::
            _M_realloc_insert<json::value*const&>
                      ((vector<json::value*,std::allocator<json::value*>> *)&paVar5->_data,iVar2,
                       &local_50);
          }
          else {
            *iVar2._M_current = local_50;
            pppvVar1 = &(paVar5->_data).
                        super__Vector_base<json::value_*,_std::allocator<json::value_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppvVar1 = *pppvVar1 + 1;
          }
          Pig::skipWS(pig);
          bVar3 = Pig::skip(pig,0x2c);
        } while (bVar3);
      }
    }
    bVar3 = Pig::skip(pig,0x5d);
    if (!bVar3) {
      psVar6 = (string *)__cxa_allocate_exception(0x20);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Error: missing \']\' at position {1}","");
      sVar4 = Pig::cursor(pig);
      format<int>(psVar6,1,&local_48,(int)sVar4);
      __cxa_throw(psVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  else {
    Pig::restoreTo(pig,sVar4);
    paVar5 = (array *)0x0;
  }
  return paVar5;
}

Assistant:

json::array* json::array::parse (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  pig.skipWS ();
  if (pig.skip ('['))
  {
    pig.skipWS ();

    auto arr = new json::array ();

    json::value* value;
    if ((value = json::value::parse (pig)))
    {
      arr->_data.push_back (value);
      value = nullptr; // Not a leak.  Looks like a leak.
      pig.skipWS ();
      while (pig.skip (','))
      {
        pig.skipWS ();

        if ((value = json::value::parse (pig)))
        {
          arr->_data.push_back (value);
          pig.skipWS ();
        }
        else
        {
          delete arr;
          throw format ("Error: missing value after ',' at position {1}", (int) pig.cursor ());
        }
      }
    }

    if (pig.skip (']'))
      return arr;
    else
      throw format ("Error: missing ']' at position {1}", (int) pig.cursor ());

    delete arr;
  }

  pig.restoreTo (checkpoint);
  return nullptr;
}